

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

ImplicitProducer * __thiscall
ylt::detail::moodycamel::
ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
::get_or_add_implicit_producer
          (ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
           *this)

{
  char cVar1;
  long lVar2;
  thread_id_t tVar3;
  ImplicitProducer *pIVar4;
  ulong uVar5;
  thread_id_t tVar6;
  ulong uVar7;
  long *plVar8;
  __pointer_type pIVar9;
  ImplicitProducerKVP *pIVar10;
  long in_RDI;
  bool bVar11;
  thread_id_t empty_1;
  size_t index_1;
  ImplicitProducer *producer;
  size_t i;
  ImplicitProducerHash *newHash;
  char *raw;
  size_t newCapacity;
  __int_type newCount;
  thread_id_t empty;
  ImplicitProducer *value;
  __int_type probedKey;
  size_t index;
  __pointer_type hash;
  __pointer_type mainHash;
  size_t hashedId;
  thread_id_t id;
  memory_order __b_4;
  memory_order __b_3;
  memory_order __b_1;
  memory_order __b_2;
  memory_order __b;
  undefined4 in_stack_fffffffffffffb60;
  memory_order in_stack_fffffffffffffb64;
  __pointer_type in_stack_fffffffffffffb68;
  undefined7 in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb77;
  undefined1 in_stack_fffffffffffffb87;
  ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
  *in_stack_fffffffffffffb88;
  ulong local_1d8;
  ulong local_1c8;
  ulong local_1b0;
  ulong local_188;
  __pointer_type local_180;
  __pointer_type local_178;
  ImplicitProducer *local_158;
  
  tVar6 = details::thread_id();
  local_1d8 = details::hash_thread_id(0x46a939);
  local_178 = std::
              atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
              ::load((atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
                      *)in_stack_fffffffffffffb68,in_stack_fffffffffffffb64);
  for (local_180 = local_178; local_188 = local_1d8, local_180 != (__pointer_type)0x0;
      local_180 = local_180->prev) {
    while( true ) {
      uVar7 = local_188 & local_180->capacity - 1;
      pIVar10 = local_180->entries;
      std::operator&(relaxed,__memory_order_mask);
      tVar3 = pIVar10[uVar7].key.super___atomic_base<unsigned_long>._M_i;
      if (tVar3 == tVar6) {
        pIVar4 = local_180->entries[uVar7].value;
        local_188 = local_1d8;
        if (local_180 == local_178) {
          return pIVar4;
        }
        while( true ) {
          uVar7 = local_188 & local_178->capacity - 1;
          LOCK();
          bVar11 = local_178->entries[uVar7].key.super___atomic_base<unsigned_long>._M_i == 0;
          if (bVar11) {
            local_178->entries[uVar7].key.super___atomic_base<unsigned_long>._M_i = tVar6;
          }
          UNLOCK();
          if (bVar11) break;
          local_188 = uVar7 + 1;
        }
        local_178->entries[uVar7].value = pIVar4;
        return pIVar4;
      }
      if (tVar3 == 0) break;
      local_188 = uVar7 + 1;
    }
  }
  plVar8 = (long *)(in_RDI + 0x38);
  LOCK();
  lVar2 = *plVar8;
  *plVar8 = *plVar8 + 1;
  UNLOCK();
  uVar7 = lVar2 + 1;
  do {
    if (local_178->capacity >> 1 <= uVar7) {
      LOCK();
      cVar1 = *(char *)(in_RDI + 600);
      *(char *)(in_RDI + 600) = '\x01';
      UNLOCK();
      if (cVar1 == '\0') {
        local_178 = std::
                    atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
                    ::load((atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
                            *)in_stack_fffffffffffffb68,in_stack_fffffffffffffb64);
        if (uVar7 < local_178->capacity >> 1) {
          std::operator&(release,__memory_order_mask);
          *(undefined1 *)(in_RDI + 600) = 0;
        }
        else {
          local_1b0 = local_178->capacity;
          do {
            uVar5 = local_1b0;
            local_1b0 = uVar5 << 1;
          } while ((uVar5 & 0x7fffffffffffffff) <= uVar7);
          pIVar9 = (__pointer_type)ConcurrentQueueDefaultTraits::malloc(uVar5 * 0x20 + 0x1f);
          if (pIVar9 == (__pointer_type)0x0) {
            LOCK();
            *(long *)(in_RDI + 0x38) = *(long *)(in_RDI + 0x38) + -1;
            UNLOCK();
            std::operator&(relaxed,__memory_order_mask);
            *(undefined1 *)(in_RDI + 600) = 0;
            return (ImplicitProducer *)0x0;
          }
          pIVar9->capacity = local_1b0;
          pIVar10 = (ImplicitProducerKVP *)
                    details::
                    align_for<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,std::default_delete<cinatra::coro_http_client>>,ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerKVP>
                              ((char *)(pIVar9 + 1));
          pIVar9->entries = pIVar10;
          for (local_1c8 = 0; local_1c8 != local_1b0; local_1c8 = local_1c8 + 1) {
            ImplicitProducerKVP::ImplicitProducerKVP
                      ((ImplicitProducerKVP *)
                       CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
            pIVar10 = pIVar9->entries;
            std::operator&(relaxed,__memory_order_mask);
            pIVar10[local_1c8].key.super___atomic_base<unsigned_long>._M_i = 0;
          }
          pIVar9->prev = local_178;
          std::
          atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
          ::store((atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
                   *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                  in_stack_fffffffffffffb68,in_stack_fffffffffffffb64);
          std::operator&(release,__memory_order_mask);
          *(undefined1 *)(in_RDI + 600) = 0;
          local_178 = pIVar9;
        }
      }
    }
    if (uVar7 < (local_178->capacity >> 1) + (local_178->capacity >> 2)) {
      local_158 = (ImplicitProducer *)
                  recycle_or_create_producer
                            (in_stack_fffffffffffffb88,(bool)in_stack_fffffffffffffb87);
      if (local_158 == (ImplicitProducer *)0x0) {
        LOCK();
        *(long *)(in_RDI + 0x38) = *(long *)(in_RDI + 0x38) + -1;
        UNLOCK();
        local_158 = (ImplicitProducer *)0x0;
      }
      else {
        while( true ) {
          local_1d8 = local_1d8 & local_178->capacity - 1;
          LOCK();
          bVar11 = local_178->entries[local_1d8].key.super___atomic_base<unsigned_long>._M_i == 0;
          if (bVar11) {
            local_178->entries[local_1d8].key.super___atomic_base<unsigned_long>._M_i = tVar6;
          }
          UNLOCK();
          if (bVar11) break;
          local_1d8 = local_1d8 + 1;
        }
        local_178->entries[local_1d8].value = local_158;
      }
      return local_158;
    }
    local_178 = std::
                atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
                ::load((atomic<ylt::detail::moodycamel::ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
                        *)in_stack_fffffffffffffb68,in_stack_fffffffffffffb64);
  } while( true );
}

Assistant:

ImplicitProducer* get_or_add_implicit_producer() {
    // Note that since the data is essentially thread-local (key is thread ID),
    // there's a reduced need for fences (memory ordering is already consistent
    // for any individual thread), except for the current table itself.

    // Start by looking for the thread ID in the current and all previous hash
    // tables. If it's not found, it must not be in there yet, since this same
    // thread would have added it previously to one of the tables that we
    // traversed.

    // Code and algorithm adapted from
    // http://preshing.com/20130605/the-worlds-simplest-lock-free-hash-table

#ifdef MCDBGQ_NOLOCKFREE_IMPLICITPRODHASH
    debug::DebugLock lock(implicitProdMutex);
#endif

    auto id = details::thread_id();
    auto hashedId = details::hash_thread_id(id);

    auto mainHash = implicitProducerHash.load(std::memory_order_acquire);
    assert(
        mainHash !=
        nullptr);  // silence clang-tidy and MSVC warnings (hash cannot be null)
    for (auto hash = mainHash; hash != nullptr; hash = hash->prev) {
      // Look for the id in this hash
      auto index = hashedId;
      while (true) {  // Not an infinite loop because at least one slot is free
                      // in the hash table
        index &= hash->capacity - 1u;

        auto probedKey =
            hash->entries[index].key.load(std::memory_order_relaxed);
        if (probedKey == id) {
          // Found it! If we had to search several hashes deep, though, we
          // should lazily add it to the current main hash table to avoid the
          // extended search next time. Note there's guaranteed to be room in
          // the current hash table since every subsequent table implicitly
          // reserves space for all previous tables (there's only one
          // implicitProducerHashCount).
          auto value = hash->entries[index].value;
          if (hash != mainHash) {
            index = hashedId;
            while (true) {
              index &= mainHash->capacity - 1u;
              auto empty = details::invalid_thread_id;
#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
              auto reusable = details::invalid_thread_id2;
              if (mainHash->entries[index].key.compare_exchange_strong(
                      empty, id, std::memory_order_seq_cst,
                      std::memory_order_relaxed) ||
                  mainHash->entries[index].key.compare_exchange_strong(
                      reusable, id, std::memory_order_seq_cst,
                      std::memory_order_relaxed)) {
#else
              if (mainHash->entries[index].key.compare_exchange_strong(
                      empty, id, std::memory_order_seq_cst,
                      std::memory_order_relaxed)) {
#endif
                mainHash->entries[index].value = value;
                break;
              }
              ++index;
            }
          }

          return value;
        }
        if (probedKey == details::invalid_thread_id) {
          break;  // Not in this hash table
        }
        ++index;
      }
    }

    // Insert!
    auto newCount =
        1 + implicitProducerHashCount.fetch_add(1, std::memory_order_relaxed);
    while (true) {
      // NOLINTNEXTLINE(clang-analyzer-core.NullDereference)
      if (newCount >= (mainHash->capacity >> 1) &&
          !implicitProducerHashResizeInProgress.test_and_set(
              std::memory_order_acquire)) {
        // We've acquired the resize lock, try to allocate a bigger hash table.
        // Note the acquire fence synchronizes with the release fence at the end
        // of this block, and hence when we reload implicitProducerHash it must
        // be the most recent version (it only gets changed within this locked
        // block).
        mainHash = implicitProducerHash.load(std::memory_order_acquire);
        if (newCount >= (mainHash->capacity >> 1)) {
          size_t newCapacity = mainHash->capacity << 1;
          while (newCount >= (newCapacity >> 1)) {
            newCapacity <<= 1;
          }
          auto raw = static_cast<char*>(
              (Traits::malloc)(sizeof(ImplicitProducerHash) +
                               std::alignment_of<ImplicitProducerKVP>::value -
                               1 + sizeof(ImplicitProducerKVP) * newCapacity));
          if (raw == nullptr) {
            // Allocation failed
            implicitProducerHashCount.fetch_sub(1, std::memory_order_relaxed);
            implicitProducerHashResizeInProgress.clear(
                std::memory_order_relaxed);
            return nullptr;
          }

          auto newHash = new (raw) ImplicitProducerHash;
          newHash->capacity = static_cast<size_t>(newCapacity);
          newHash->entries = reinterpret_cast<ImplicitProducerKVP*>(
              details::align_for<ImplicitProducerKVP>(
                  raw + sizeof(ImplicitProducerHash)));
          for (size_t i = 0; i != newCapacity; ++i) {
            new (newHash->entries + i) ImplicitProducerKVP;
            newHash->entries[i].key.store(details::invalid_thread_id,
                                          std::memory_order_relaxed);
          }
          newHash->prev = mainHash;
          implicitProducerHash.store(newHash, std::memory_order_release);
          implicitProducerHashResizeInProgress.clear(std::memory_order_release);
          mainHash = newHash;
        }
        else {
          implicitProducerHashResizeInProgress.clear(std::memory_order_release);
        }
      }

      // If it's < three-quarters full, add to the old one anyway so that we
      // don't have to wait for the next table to finish being allocated by
      // another thread (and if we just finished allocating above, the condition
      // will always be true)
      if (newCount < (mainHash->capacity >> 1) + (mainHash->capacity >> 2)) {
        auto producer =
            static_cast<ImplicitProducer*>(recycle_or_create_producer(false));
        if (producer == nullptr) {
          implicitProducerHashCount.fetch_sub(1, std::memory_order_relaxed);
          return nullptr;
        }

#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
        producer->threadExitListener.callback =
            &ConcurrentQueue::implicit_producer_thread_exited_callback;
        producer->threadExitListener.userData = producer;
        details::ThreadExitNotifier::subscribe(&producer->threadExitListener);
#endif

        auto index = hashedId;
        while (true) {
          index &= mainHash->capacity - 1u;
          auto empty = details::invalid_thread_id;
#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
          auto reusable = details::invalid_thread_id2;
          if (mainHash->entries[index].key.compare_exchange_strong(
                  reusable, id, std::memory_order_seq_cst,
                  std::memory_order_relaxed)) {
            implicitProducerHashCount.fetch_sub(
                1,
                std::memory_order_relaxed);  // already counted as a used slot
            mainHash->entries[index].value = producer;
            break;
          }
#endif
          if (mainHash->entries[index].key.compare_exchange_strong(
                  empty, id, std::memory_order_seq_cst,
                  std::memory_order_relaxed)) {
            mainHash->entries[index].value = producer;
            break;
          }
          ++index;
        }
        return producer;
      }

      // Hmm, the old hash is quite full and somebody else is busy allocating a
      // new one. We need to wait for the allocating thread to finish (if it
      // succeeds, we add, if not, we try to allocate ourselves).
      mainHash = implicitProducerHash.load(std::memory_order_acquire);
    }
  }

#ifdef MOODYCAMEL_CPP11_THREAD_LOCAL_SUPPORTED
  void implicit_producer_thread_exited(ImplicitProducer* producer) {
    // Remove from hash
#ifdef MCDBGQ_NOLOCKFREE_IMPLICITPRODHASH
    debug::DebugLock lock(implicitProdMutex);
#endif
    auto hash = implicitProducerHash.load(std::memory_order_acquire);
    assert(hash != nullptr);  // The thread exit listener is only registered if
                              // we were added to a hash in the first place
    auto id = details::thread_id();
    auto hashedId = details::hash_thread_id(id);
    details::thread_id_t probedKey;

    // We need to traverse all the hashes just in case other threads aren't on
    // the current one yet and are trying to add an entry thinking there's a
    // free slot (because they reused a producer)
    for (; hash != nullptr; hash = hash->prev) {
      auto index = hashedId;
      do {
        index &= hash->capacity - 1u;
        probedKey = id;
        if (hash->entries[index].key.compare_exchange_strong(
                probedKey, details::invalid_thread_id2,
                std::memory_order_seq_cst, std::memory_order_relaxed)) {
          break;
        }
        ++index;
      } while (
          probedKey !=
          details::invalid_thread_id);  // Can happen if the hash has changed
                                        // but we weren't put back in it yet, or
                                        // if we weren't added to this hash in
                                        // the first place
    }

    // Mark the queue as being recyclable
    producer->inactive.store(true, std::memory_order_release);
  }

  static void implicit_producer_thread_exited_callback(void* userData) {
    auto producer = static_cast<ImplicitProducer*>(userData);
    auto queue = producer->parent;
    queue->implicit_producer_thread_exited(producer);
  }
#endif

  //////////////////////////////////
  // Utility functions
  //////////////////////////////////

  template <typename TAlign>
  static inline void* aligned_malloc(size_t size) {
    MOODYCAMEL_CONSTEXPR_IF(std::alignment_of<TAlign>::value <=
                            std::alignment_of<details::max_align_t>::value)
    return (Traits::malloc)(size);
    else {
      size_t alignment = std::alignment_of<TAlign>::value;
      void* raw = (Traits::malloc)(size + alignment - 1 + sizeof(void*));
      if (!raw)
        return nullptr;
      char* ptr = details::align_for<TAlign>(reinterpret_cast<char*>(raw) +
                                             sizeof(void*));
      *(reinterpret_cast<void**>(ptr) - 1) = raw;
      return ptr;
    }
  }